

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUtil.cc
# Opt level: O1

vector<int,_std::allocator<int>_> *
QUtil::parse_numrange(vector<int,_std::allocator<int>_> *__return_storage_ptr__,char *range,int max)

{
  const_iterator __position;
  char cVar1;
  _Base_ptr p_Var2;
  iterator __position_00;
  pointer piVar3;
  vector<int,std::allocator<int>> *this;
  bool bVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  size_t sVar8;
  char *pcVar9;
  runtime_error *prVar10;
  const_iterator cVar11;
  pointer psVar12;
  const_iterator cVar13;
  ulong uVar14;
  byte bVar15;
  pointer psVar16;
  undefined1 is_span;
  int *piVar17;
  ulong uVar18;
  bool bVar19;
  vector<int,_std::allocator<int>_> result;
  vector<int,_std::allocator<int>_> last_group;
  set<int,_std::less<int>,_std::allocator<int>_> exclusions;
  vector<int,_std::allocator<int>_> work;
  cmatch m;
  anon_class_8_1_ba1d60c4 parse_num;
  int n;
  void *local_168;
  long lStack_160;
  long local_158;
  char *local_140;
  int *local_138;
  iterator iStack_130;
  int *local_128;
  undefined1 local_118 [32];
  _Base_ptr local_f8;
  size_t local_f0;
  vector<int,_std::allocator<int>_> local_e8;
  match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_> local_c8;
  char *local_a8;
  ulong local_a0;
  int local_94;
  vector<int,std::allocator<int>> *local_90;
  char *local_88;
  anon_class_8_1_ba1d60c4 local_80;
  int local_78 [8];
  _Alloc_node local_58 [5];
  
  local_a8 = range;
  local_94 = max;
  local_90 = (vector<int,std::allocator<int>> *)__return_storage_ptr__;
  if ((parse_numrange(char_const*,int)::group_re_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&parse_numrange(char_const*,int)::group_re_abi_cxx11_), iVar5 != 0
     )) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&parse_numrange(char_const*,int)::group_re_abi_cxx11_,
               "(x)?(z|r?\\d+)(?:-(z|r?\\d+))?",0x10);
    __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                 &parse_numrange(char_const*,int)::group_re_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&parse_numrange(char_const*,int)::group_re_abi_cxx11_);
    range = local_a8;
  }
  local_80.max = &local_94;
  sVar8 = strlen(range);
  local_158 = 0;
  local_168 = (void *)0x0;
  lStack_160 = 0;
  local_128 = (int *)0x0;
  local_138 = (int *)0x0;
  iStack_130._M_current = (int *)0x0;
  local_118[0] = 0x3a;
  pcVar9 = std::__find_if<char_const*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                     (range,range + sVar8,local_118);
  cVar1 = *pcVar9;
  if (cVar1 == ':') {
    iVar5 = strcmp(pcVar9,":odd");
    if (iVar5 == 0) {
      local_a0 = 0;
    }
    else {
      iVar5 = strcmp(pcVar9,":even");
      if (iVar5 != 0) {
        local_140 = pcVar9;
        prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar10,"expected :even or :odd");
        __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      local_a0 = 1;
    }
  }
  else {
    local_a0 = 0;
    pcVar9 = range + sVar8;
  }
  if (pcVar9 != range) {
    bVar15 = 1;
    __position._M_node = (_Base_ptr)(local_118 + 8);
    local_88 = pcVar9;
    do {
      local_118[0] = 0x2c;
      local_140 = range;
      pcVar9 = std::__find_if<char_const*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                         (range,local_88,local_118);
      local_c8.
      super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
      .
      super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_c8._M_begin = (char *)0x0;
      local_c8.
      super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
      .
      super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_c8.
      super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
      .
      super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      iVar5 = 0;
      bVar4 = std::__detail::
              __regex_algo_impl<char_const*,std::allocator<std::__cxx11::sub_match<char_const*>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                        (range,pcVar9,&local_c8,
                         &parse_numrange(char_const*,int)::group_re_abi_cxx11_,0);
      if (!bVar4) {
        prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar10,"invalid range syntax");
        __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      if (local_c8.
          super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
          .
          super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          local_c8.
          super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
          .
          super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        bVar4 = false;
      }
      else {
        bVar4 = ((long)local_c8.
                       super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                       .
                       super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_c8.
                       super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                       .
                       super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 - 5U <
                0xfffffffffffffffe;
      }
      psVar12 = local_c8.
                super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                .
                super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                ._M_impl.super__Vector_impl_data._M_start + 1;
      if (!bVar4) {
        psVar12 = local_c8.
                  super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                  .
                  super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish + -3;
      }
      bVar4 = psVar12->matched;
      if ((bVar15 & bVar4) != 0) {
        prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar10,"first range group may not be an exclusion");
        __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      if (local_c8.
          super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
          .
          super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          local_c8.
          super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
          .
          super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        bVar19 = false;
      }
      else {
        bVar19 = ((long)local_c8.
                        super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                        .
                        super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_c8.
                        super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                        .
                        super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 - 6U <
                 0xfffffffffffffffd;
      }
      psVar12 = local_c8.
                super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                .
                super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                ._M_impl.super__Vector_impl_data._M_finish + -3;
      if (bVar19) {
        psVar12 = local_c8.
                  super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                  .
                  super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + 2;
      }
      if (psVar12->matched == true) {
        local_118._0_8_ = local_118 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_118,(psVar12->super_pair<const_char_*,_const_char_*>).first,
                   (psVar12->super_pair<const_char_*,_const_char_*>).second);
      }
      else {
        local_118._0_8_ = local_118 + 0x10;
        local_118._8_8_ = 0;
        local_118._16_8_ = local_118._16_8_ & 0xffffffffffffff00;
      }
      uVar6 = parse_numrange::anon_class_8_1_ba1d60c4::operator()(&local_80,(string *)local_118);
      if ((undefined1 *)local_118._0_8_ != local_118 + 0x10) {
        operator_delete((void *)local_118._0_8_,(ulong)(local_118._16_8_ + 1));
      }
      is_span = false;
      if (local_c8.
          super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
          .
          super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          local_c8.
          super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
          .
          super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        bVar19 = false;
      }
      else {
        bVar19 = ((long)local_c8.
                        super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                        .
                        super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_c8.
                        super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                        .
                        super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 - 7U <
                 0xfffffffffffffffc;
      }
      psVar12 = local_c8.
                super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                .
                super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                ._M_impl.super__Vector_impl_data._M_finish + -3;
      psVar16 = psVar12;
      if (bVar19) {
        psVar16 = local_c8.
                  super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                  .
                  super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + 3;
      }
      bVar19 = psVar16->matched;
      if (bVar19 == true) {
        if ((local_c8.
             super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
             .
             super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
             ._M_impl.super__Vector_impl_data._M_start !=
             local_c8.
             super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
             .
             super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
             ._M_impl.super__Vector_impl_data._M_finish) &&
           (((long)local_c8.
                   super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                   .
                   super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_c8.
                   super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                   .
                   super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 - 7U <
            0xfffffffffffffffc)) {
          psVar12 = local_c8.
                    super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                    .
                    super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 3;
        }
        if (psVar12->matched == true) {
          local_118._0_8_ = local_118 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_118,(psVar12->super_pair<const_char_*,_const_char_*>).first,
                     (psVar12->super_pair<const_char_*,_const_char_*>).second);
        }
        else {
          local_118._0_8_ = local_118 + 0x10;
          local_118._8_8_ = 0;
          local_118._16_8_ = local_118._16_8_ & 0xffffffffffffff00;
        }
        iVar7 = parse_numrange::anon_class_8_1_ba1d60c4::operator()(&local_80,(string *)local_118);
        is_span = (undefined1)iVar7;
        if ((undefined1 *)local_118._0_8_ != local_118 + 0x10) {
          operator_delete((void *)local_118._0_8_,(ulong)(local_118._16_8_ + 1));
        }
      }
      if ((bVar4 & 1U) == 0) {
        std::vector<int,std::allocator<int>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                  ((vector<int,std::allocator<int>> *)&local_168,lStack_160,local_138,
                   iStack_130._M_current);
        parse_numrange::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)&local_138,
                   (vector<int,_std::allocator<int>_> *)(ulong)uVar6,(uint)bVar19,(bool)is_span,
                   iVar5);
      }
      else {
        local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (int *)0x0;
        local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = (int *)0x0;
        local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        parse_numrange::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)&local_e8,
                   (vector<int,_std::allocator<int>_> *)(ulong)uVar6,(uint)bVar19,(bool)is_span,
                   iVar5);
        piVar3 = local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        local_118._8_8_ = local_118._8_8_ & 0xffffffff00000000;
        local_118._16_8_ = (_Base_ptr)0x0;
        local_f0 = 0;
        local_58[0]._M_t =
             (_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             local_118;
        local_118._24_8_ = __position._M_node;
        local_f8 = __position._M_node;
        for (piVar17 = local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start; piVar17 != piVar3; piVar17 = piVar17 + 1) {
          std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
          _M_insert_unique_<int&,std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::_Alloc_node>
                    ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                     local_118,__position,piVar17,local_58);
        }
        std::vector<int,_std::allocator<int>_>::operator=
                  (&local_e8,(vector<int,_std::allocator<int>_> *)&local_138);
        piVar3 = local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        piVar17 = local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if (iStack_130._M_current != local_138) {
          iStack_130._M_current = local_138;
        }
        for (; piVar17 != piVar3; piVar17 = piVar17 + 1) {
          local_78[0] = *piVar17;
          cVar11._M_node = __position._M_node;
          for (p_Var2 = (_Base_ptr)local_118._16_8_; p_Var2 != (_Base_ptr)0x0;
              p_Var2 = (&p_Var2->_M_left)[(int)p_Var2[1]._M_color < local_78[0]]) {
            if (local_78[0] <= (int)p_Var2[1]._M_color) {
              cVar11._M_node = p_Var2;
            }
          }
          cVar13._M_node = __position._M_node;
          if ((cVar11._M_node != __position._M_node) &&
             (cVar13._M_node = cVar11._M_node, local_78[0] < (int)cVar11._M_node[1]._M_color)) {
            cVar13._M_node = __position._M_node;
          }
          if (cVar13._M_node == __position._M_node) {
            if (iStack_130._M_current == local_128) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int&>
                        ((vector<int,std::allocator<int>> *)&local_138,iStack_130,local_78);
            }
            else {
              *iStack_130._M_current = local_78[0];
              iStack_130._M_current = iStack_130._M_current + 1;
            }
          }
        }
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
        ~_Rb_tree((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
                  local_118);
        if (local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (int *)0x0) {
          operator_delete(local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
      }
      if ((*pcVar9 == ',') && (pcVar9 = pcVar9 + 1, pcVar9 == local_88)) {
        prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar10,"trailing comma");
        __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      if (local_c8.
          super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
          .
          super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_c8.
                        super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                        .
                        super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_c8.
                              super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                              .
                              super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_c8.
                              super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                              .
                              super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      bVar15 = 0;
      range = pcVar9;
    } while (pcVar9 != local_88);
  }
  std::vector<int,std::allocator<int>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((vector<int,std::allocator<int>> *)&local_168,lStack_160,local_138,
             iStack_130._M_current);
  this = local_90;
  if (cVar1 == ':') {
    *(undefined8 *)local_90 = 0;
    *(undefined8 *)(local_90 + 8) = 0;
    *(undefined8 *)(local_90 + 0x10) = 0;
    if (local_a0 < (ulong)(lStack_160 - (long)local_168 >> 2)) {
      uVar14 = (ulong)(uint)((int)local_a0 * 4);
      uVar18 = local_a0;
      do {
        __position_00._M_current = *(int **)(this + 8);
        if (__position_00._M_current == *(int **)(this + 0x10)) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int&>
                    (this,__position_00,(int *)((long)local_168 + uVar14));
        }
        else {
          *__position_00._M_current = *(int *)((long)local_168 + uVar14);
          *(int **)(this + 8) = __position_00._M_current + 1;
        }
        uVar18 = uVar18 + 2;
        uVar14 = uVar14 + 8;
      } while (uVar18 < (ulong)(lStack_160 - (long)local_168 >> 2));
    }
  }
  else {
    *(void **)local_90 = local_168;
    *(long *)(local_90 + 8) = lStack_160;
    *(long *)(local_90 + 0x10) = local_158;
    local_168 = (void *)0x0;
    lStack_160 = 0;
    local_158 = 0;
  }
  if (local_138 != (int *)0x0) {
    operator_delete(local_138,(long)local_128 - (long)local_138);
  }
  if (local_168 != (void *)0x0) {
    operator_delete(local_168,local_158 - (long)local_168);
  }
  return (vector<int,_std::allocator<int>_> *)this;
}

Assistant:

std::vector<int>
QUtil::parse_numrange(char const* range, int max)
{
    // Performance note: this implementation aims to be straightforward, not efficient. Numeric
    // range parsing is used only during argument processing. It is not used during processing of
    // PDF files.

    static std::regex group_re(R"((x)?(z|r?\d+)(?:-(z|r?\d+))?)");
    auto parse_num = [&max](std::string const& s) -> int {
        if (s == "z") {
            return max;
        }
        int num;
        if (s.at(0) == 'r') {
            num = max + 1 - string_to_int(s.substr(1).c_str());
        } else {
            num = string_to_int(s.c_str());
        }
        // max == 0 means we don't know the max and are just testing for valid syntax.
        if ((max > 0) && ((num < 1) || (num > max))) {
            throw std::runtime_error("number " + std::to_string(num) + " out of range");
        }
        return num;
    };

    auto populate = [](std::vector<int>& group, int first_num, bool is_span, int last_num) {
        group.clear();
        group.emplace_back(first_num);
        if (is_span) {
            if (first_num > last_num) {
                for (auto i = first_num - 1; i >= last_num; --i) {
                    group.push_back(i);
                }
            } else {
                for (auto i = first_num + 1; i <= last_num; ++i) {
                    group.push_back(i);
                }
            }
        }
    };

    char const* p;
    try {
        char const* range_end = range + strlen(range);
        std::vector<int> result;
        std::vector<int> last_group;
        // See if range ends with :even or :odd.
        size_t start_idx = 0;
        size_t skip = 1;
        p = std::find(range, range_end, ':');
        if (*p == ':') {
            if (strcmp(p, ":odd") == 0) {
                skip = 2;
            } else if (strcmp(p, ":even") == 0) {
                skip = 2;
                start_idx = 1;
            } else {
                throw std::runtime_error("expected :even or :odd");
            }
            range_end = p;
        }

        // Divide the range into groups
        p = range;
        char const* group_end;
        bool first = true;
        while (p != range_end) {
            group_end = std::find(p, range_end, ',');
            std::cmatch m;
            if (!std::regex_match(p, group_end, m, group_re)) {
                throw std::runtime_error("invalid range syntax");
            }
            auto is_exclude = m[1].matched;
            if (first && is_exclude) {
                throw std::runtime_error("first range group may not be an exclusion");
            }
            first = false;
            auto first_num = parse_num(m[2].str());
            auto is_span = m[3].matched;
            int last_num{0};
            if (is_span) {
                last_num = parse_num(m[3].str());
            }
            if (is_exclude) {
                std::vector<int> work;
                populate(work, first_num, is_span, last_num);
                std::set<int> exclusions;
                exclusions.insert(work.begin(), work.end());
                work = last_group;
                last_group.clear();
                for (auto n: work) {
                    if (exclusions.count(n) == 0) {
                        last_group.emplace_back(n);
                    }
                }
            } else {
                result.insert(result.end(), last_group.begin(), last_group.end());
                populate(last_group, first_num, is_span, last_num);
            }
            p = group_end;
            if (*p == ',') {
                ++p;
                if (p == range_end) {
                    throw std::runtime_error("trailing comma");
                }
            }
        }
        result.insert(result.end(), last_group.begin(), last_group.end());
        if (skip == 1) {
            return result;
        }
        std::vector<int> filtered;
        for (auto i = start_idx; i < result.size(); i += skip) {
            filtered.emplace_back(result.at(i));
        }
        return filtered;
    } catch (std::runtime_error const& e) {
        std::string message;
        if (p) {
            message = "error at * in numeric range " +
                std::string(range, QIntC::to_size(p - range)) + "*" + p + ": " + e.what();
        } else {
            message = "error in numeric range " + std::string(range) + ": " + e.what();
        }
        throw std::runtime_error(message);
    }
}